

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TriangulateProcess.cpp
# Opt level: O0

bool __thiscall Assimp::TriangulateProcess::TriangulateMesh(TriangulateProcess *this,aiMesh *pMesh)

{
  float *pfVar1;
  aiVector3t<float> *v1_00;
  aiVector3t<float> *v1_01;
  undefined8 uVar2;
  uint *puVar3;
  undefined1 auVar4 [16];
  int iVar5;
  pointer paVar6;
  pointer paVar7;
  bool bVar8;
  uint uVar9;
  aiFace *paVar10;
  uint *puVar11;
  ulong uVar12;
  ulong uVar13;
  ulong *puVar14;
  bool *__p;
  aiFace *paVar15;
  void *pvVar16;
  undefined8 *puVar17;
  reference pvVar18;
  reference pvVar19;
  reference pvVar20;
  reference pvVar21;
  type pbVar22;
  reference p0;
  reference p1;
  reference this_00;
  Logger *this_01;
  aiFace *this_02;
  ulong uVar23;
  float fVar24;
  double dVar25;
  double dVar26;
  aiVector3t<float> aVar27;
  float local_324;
  float local_320;
  float local_31c;
  aiFace *local_238;
  uint *i_1;
  aiFace *f;
  aiFace *nface_3;
  aiFace *nface_2;
  aiVector2D *vtmp;
  aiVector2D *pnt2;
  aiVector2D *pnt0;
  aiVector2D *pnt1;
  int num_found;
  float inv;
  uint bc;
  uint ac;
  float az;
  float ay;
  float ax;
  aiVector3D n;
  aiFace *sface;
  aiFace *nface_1;
  uint temp [4];
  float angle;
  undefined1 local_178 [8];
  aiVector3D right;
  undefined1 local_158 [8];
  aiVector3D diag;
  undefined1 local_138 [8];
  aiVector3D left;
  aiVector3D *v;
  aiVector3D *v2;
  aiVector3D *v1;
  aiVector3D *v0;
  uint i;
  uint start_vertex;
  aiFace *nface;
  aiFace *last_face;
  int max;
  int next;
  int prev;
  int tmp;
  int ear;
  int num;
  uint *idx;
  aiFace *face_2;
  uint a_2;
  unique_ptr<bool[],_std::default_delete<bool[]>_> done;
  aiVector3D *verts;
  undefined1 local_a8 [8];
  vector<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_> temp_verts;
  allocator<aiVector3t<float>_> local_79;
  undefined1 local_78 [8];
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> temp_verts3d;
  aiFace *curOut;
  aiFace *out;
  aiVector3D *nor_out;
  aiFace *face_1;
  uint a_1;
  uint uStack_34;
  bool get_normals;
  uint max_out;
  uint numOut;
  aiFace *face;
  uint a;
  bool bNeed;
  aiMesh *pMesh_local;
  TriangulateProcess *this_local;
  
  if (pMesh->mPrimitiveTypes == 0) {
    face._7_1_ = '\0';
    for (face._0_4_ = 0; (uint)face < pMesh->mNumFaces; face._0_4_ = (uint)face + 1) {
      _max_out = pMesh->mFaces + (uint)face;
      if (_max_out->mNumIndices != 3) {
        face._7_1_ = '\x01';
      }
    }
    if (face._7_1_ == '\0') {
      this_local._7_1_ = 0;
      goto LAB_001b06b1;
    }
  }
  else if ((pMesh->mPrimitiveTypes & 8) == 0) {
    this_local._7_1_ = 0;
    goto LAB_001b06b1;
  }
  uStack_34 = 0;
  a_1 = 0;
  _a = pMesh;
  pMesh_local = (aiMesh *)this;
  for (face_1._0_4_ = 0; (uint)face_1 < _a->mNumFaces; face_1._0_4_ = (uint)face_1 + 1) {
    paVar10 = _a->mFaces + (uint)face_1;
    if (paVar10->mNumIndices < 4) {
      uStack_34 = uStack_34 + 1;
    }
    else {
      uStack_34 = (paVar10->mNumIndices - 2) + uStack_34;
      puVar11 = std::max<unsigned_int>(&a_1,&paVar10->mNumIndices);
      a_1 = *puVar11;
    }
  }
  if (uStack_34 == _a->mNumFaces) {
    __assert_fail("numOut != pMesh->mNumFaces",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/royalneverwin[P]Computer_graphics/third_party/assimp/code/PostProcessing/TriangulateProcess.cpp"
                  ,0xa2,"bool Assimp::TriangulateProcess::TriangulateMesh(aiMesh *)");
  }
  _a->mPrimitiveTypes = _a->mPrimitiveTypes | 4;
  _a->mPrimitiveTypes = _a->mPrimitiveTypes & 0xfffffff7;
  uVar12 = CONCAT44(0,uStack_34);
  auVar4._8_8_ = 0;
  auVar4._0_8_ = uVar12;
  uVar13 = SUB168(auVar4 * ZEXT816(0x10),0);
  uVar23 = uVar13 + 8;
  if (SUB168(auVar4 * ZEXT816(0x10),8) != 0 || 0xfffffffffffffff7 < uVar13) {
    uVar23 = 0xffffffffffffffff;
  }
  puVar14 = (ulong *)operator_new__(uVar23);
  *puVar14 = uVar12;
  paVar10 = (aiFace *)(puVar14 + 1);
  if (uVar12 != 0) {
    local_238 = paVar10;
    do {
      aiFace::aiFace(local_238);
      local_238 = local_238 + 1;
    } while (local_238 != paVar10 + uVar12);
  }
  uVar9 = a_1 + 2;
  temp_verts3d.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)paVar10;
  std::allocator<aiVector3t<float>_>::allocator(&local_79);
  std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::vector
            ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)local_78,(ulong)uVar9
             ,&local_79);
  std::allocator<aiVector3t<float>_>::~allocator(&local_79);
  uVar9 = a_1 + 2;
  std::allocator<aiVector2t<float>_>::allocator((allocator<aiVector2t<float>_> *)((long)&verts + 7))
  ;
  std::vector<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>::vector
            ((vector<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_> *)local_a8,(ulong)uVar9
             ,(allocator<aiVector2t<float>_> *)((long)&verts + 7));
  std::allocator<aiVector2t<float>_>::~allocator
            ((allocator<aiVector2t<float>_> *)((long)&verts + 7));
  done._M_t.super___uniq_ptr_impl<bool,_std::default_delete<bool[]>_>._M_t.
  super__Tuple_impl<0UL,_bool_*,_std::default_delete<bool[]>_>.super__Head_base<0UL,_bool_*,_false>.
  _M_head_impl = (__uniq_ptr_data<bool,_std::default_delete<bool[]>,_true,_true>)_a->mVertices;
  __p = (bool *)operator_new__((ulong)a_1);
  std::unique_ptr<bool[],std::default_delete<bool[]>>::
  unique_ptr<bool*,std::default_delete<bool[]>,void,bool>
            ((unique_ptr<bool[],std::default_delete<bool[]>> *)&stack0xffffffffffffff40,__p);
  for (face_2._4_4_ = 0;
      i_1 = (uint *)temp_verts3d.
                    super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage, face_2._4_4_ < _a->mNumFaces;
      face_2._4_4_ = face_2._4_4_ + 1) {
    paVar15 = _a->mFaces + face_2._4_4_;
    puVar11 = paVar15->mIndices;
    uVar9 = paVar15->mNumIndices;
    max = uVar9 - 1;
    last_face._4_4_ = 0;
    if (paVar15->mNumIndices < 4) {
      (temp_verts3d.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage)->x = (float)paVar15->mNumIndices;
      *(uint **)&(temp_verts3d.
                  super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl
                  .super__Vector_impl_data._M_end_of_storage)->z = paVar15->mIndices;
      paVar15->mIndices = (uint *)0x0;
      temp_verts3d.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage =
           (pointer)&temp_verts3d.
                     super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage[1].y;
    }
    else if (paVar15->mNumIndices == 4) {
      v0._4_4_ = 0;
      for (v0._0_4_ = 0; (uint)v0 < 4; v0._0_4_ = (uint)v0 + 1) {
        v1_00 = (aiVector3t<float> *)
                ((long)done._M_t.super___uniq_ptr_impl<bool,_std::default_delete<bool[]>_>._M_t.
                       super__Tuple_impl<0UL,_bool_*,_std::default_delete<bool[]>_>.
                       super__Head_base<0UL,_bool_*,_false>._M_head_impl +
                (ulong)paVar15->mIndices[(uint)v0 + 2 & 3] * 0xc);
        v1_01 = (aiVector3t<float> *)
                ((long)done._M_t.super___uniq_ptr_impl<bool,_std::default_delete<bool[]>_>._M_t.
                       super__Tuple_impl<0UL,_bool_*,_std::default_delete<bool[]>_>.
                       super__Head_base<0UL,_bool_*,_false>._M_head_impl +
                (ulong)paVar15->mIndices[(uint)v0 + 1 & 3] * 0xc);
        unique0x00004a80 =
             (aiVector3t<float> *)
             ((long)done._M_t.super___uniq_ptr_impl<bool,_std::default_delete<bool[]>_>._M_t.
                    super__Tuple_impl<0UL,_bool_*,_std::default_delete<bool[]>_>.
                    super__Head_base<0UL,_bool_*,_false>._M_head_impl +
             (ulong)paVar15->mIndices[(uint)v0] * 0xc);
        aVar27 = ::operator-((aiVector3t<float> *)
                             ((long)done._M_t.
                                    super___uniq_ptr_impl<bool,_std::default_delete<bool[]>_>._M_t.
                                    super__Tuple_impl<0UL,_bool_*,_std::default_delete<bool[]>_>.
                                    super__Head_base<0UL,_bool_*,_false>._M_head_impl +
                             (ulong)paVar15->mIndices[(uint)v0 - 1 & 3] * 0xc),unique0x00004a80);
        left.x = aVar27.z;
        register0x00001200 = aVar27._0_8_;
        local_138 = (undefined1  [8])register0x00001200;
        aVar27 = ::operator-(v1_00,stack0xfffffffffffffed8);
        diag.x = aVar27.z;
        register0x00001200 = aVar27._0_8_;
        local_158 = (undefined1  [8])register0x00001200;
        aVar27 = ::operator-(v1_01,stack0xfffffffffffffed8);
        right.x = aVar27.z;
        local_178 = aVar27._0_8_;
        aiVector3t<float>::Normalize((aiVector3t<float> *)local_138);
        aiVector3t<float>::Normalize((aiVector3t<float> *)local_158);
        aiVector3t<float>::Normalize((aiVector3t<float> *)local_178);
        fVar24 = ::operator*((aiVector3t<float> *)local_138,(aiVector3t<float> *)local_158);
        dVar25 = std::acos((double)(ulong)(uint)fVar24);
        fVar24 = ::operator*((aiVector3t<float> *)local_178,(aiVector3t<float> *)local_158);
        dVar26 = std::acos((double)(ulong)(uint)fVar24);
        if (3.1415927 < SUB84(dVar25,0) + SUB84(dVar26,0)) {
          v0._4_4_ = (uint)v0;
          break;
        }
      }
      paVar7 = temp_verts3d.
               super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
      temp[0] = paVar15->mIndices[2];
      temp[1] = paVar15->mIndices[3];
      n._4_8_ = &temp_verts3d.
                 super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage[1].y;
      temp_verts3d.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)n._4_8_;
      paVar7->x = 4.2039e-45;
      *(uint **)&paVar7->z = paVar15->mIndices;
      **(uint **)&paVar7->z = temp[(ulong)v0._4_4_ - 2];
      *(uint *)(*(long *)&paVar7->z + 4) = temp[(ulong)(v0._4_4_ + 1 & 3) - 2];
      *(uint *)(*(long *)&paVar7->z + 8) = temp[(ulong)(v0._4_4_ + 2 & 3) - 2];
      temp_verts3d.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)&paVar7[2].z;
      *(float *)n._4_8_ = 4.2039e-45;
      pvVar16 = operator_new__(0xc);
      *(void **)(n._4_8_ + 8) = pvVar16;
      **(uint **)(n._4_8_ + 8) = temp[(ulong)v0._4_4_ - 2];
      *(uint *)(*(long *)(n._4_8_ + 8) + 4) = temp[(ulong)(v0._4_4_ + 2 & 3) - 2];
      *(uint *)(*(long *)(n._4_8_ + 8) + 8) = temp[(ulong)(v0._4_4_ + 3 & 3) - 2];
      paVar15->mIndices = (uint *)0x0;
    }
    else {
      for (next = 0; next < (int)uVar9; next = next + 1) {
        puVar17 = (undefined8 *)
                  ((long)done._M_t.super___uniq_ptr_impl<bool,_std::default_delete<bool[]>_>._M_t.
                         super__Tuple_impl<0UL,_bool_*,_std::default_delete<bool[]>_>.
                         super__Head_base<0UL,_bool_*,_false>._M_head_impl +
                  (ulong)puVar11[next] * 0xc);
        pvVar18 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::operator[]
                            ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
                             local_78,(long)next);
        uVar2 = *puVar17;
        pvVar18->x = (float)(int)uVar2;
        pvVar18->y = (float)(int)((ulong)uVar2 >> 0x20);
        pvVar18->z = *(float *)(puVar17 + 1);
      }
      aiVector3t<float>::aiVector3t((aiVector3t<float> *)&ay);
      pvVar18 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::front
                          ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
                           local_78);
      pvVar19 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::front
                          ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
                           local_78);
      pvVar20 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::front
                          ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
                           local_78);
      NewellNormal<3,3,3,float>((aiVector3t<float> *)&ay,uVar9,&pvVar18->x,&pvVar19->y,&pvVar20->z);
      if (ay <= 0.0) {
        local_31c = -ay;
      }
      else {
        local_31c = ay;
      }
      az = local_31c;
      if (ax <= 0.0) {
        local_320 = -ax;
      }
      else {
        local_320 = ax;
      }
      ac = (uint)local_320;
      if (n.x <= 0.0) {
        local_324 = -n.x;
      }
      else {
        local_324 = n.x;
      }
      bc = (uint)local_324;
      inv = 0.0;
      num_found = 1;
      pnt1._4_4_ = n.x;
      if (local_31c <= local_320) {
        if (local_324 < local_320) {
          inv = 2.8026e-45;
          pnt1._4_4_ = ax;
        }
        num_found = (int)(local_320 <= local_324);
      }
      else {
        if (local_324 < local_31c) {
          num_found = 2;
          pnt1._4_4_ = ay;
        }
        inv = (float)(uint)(local_324 < local_31c);
      }
      if (pnt1._4_4_ < 0.0) {
        std::swap<unsigned_int>((uint *)&inv,(uint *)&num_found);
      }
      for (next = 0; tmp = uVar9, next < (int)uVar9; next = next + 1) {
        fVar24 = aiVector3t<float>::operator[]
                           ((aiVector3t<float> *)
                            ((long)done._M_t.
                                   super___uniq_ptr_impl<bool,_std::default_delete<bool[]>_>._M_t.
                                   super__Tuple_impl<0UL,_bool_*,_std::default_delete<bool[]>_>.
                                   super__Head_base<0UL,_bool_*,_false>._M_head_impl +
                            (ulong)puVar11[next] * 0xc),(uint)inv);
        pvVar21 = std::vector<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>::operator[]
                            ((vector<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_> *)
                             local_a8,(long)next);
        pvVar21->x = fVar24;
        fVar24 = aiVector3t<float>::operator[]
                           ((aiVector3t<float> *)
                            ((long)done._M_t.
                                   super___uniq_ptr_impl<bool,_std::default_delete<bool[]>_>._M_t.
                                   super__Tuple_impl<0UL,_bool_*,_std::default_delete<bool[]>_>.
                                   super__Head_base<0UL,_bool_*,_false>._M_head_impl +
                            (ulong)puVar11[next] * 0xc),num_found);
        pvVar21 = std::vector<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>::operator[]
                            ((vector<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_> *)
                             local_a8,(long)next);
        pvVar21->y = fVar24;
        pbVar22 = std::unique_ptr<bool[],_std::default_delete<bool[]>_>::operator[]
                            ((unique_ptr<bool[],_std::default_delete<bool[]>_> *)
                             &stack0xffffffffffffff40,(long)next);
        *pbVar22 = false;
      }
      for (; 3 < tmp; tmp = tmp + -1) {
        pnt1._0_4_ = 0;
        prev = last_face._4_4_;
        while( true ) {
          do {
            last_face._4_4_ = last_face._4_4_ + 1;
            if ((int)uVar9 <= last_face._4_4_) {
              last_face._4_4_ = 0;
            }
            pbVar22 = std::unique_ptr<bool[],_std::default_delete<bool[]>_>::operator[]
                                ((unique_ptr<bool[],_std::default_delete<bool[]>_> *)
                                 &stack0xffffffffffffff40,(long)last_face._4_4_);
          } while ((*pbVar22 & 1U) != 0);
          if ((last_face._4_4_ < prev) && (pnt1._0_4_ = (int)pnt1 + 1, (int)pnt1 == 2)) break;
          pvVar21 = std::vector<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>::operator[]
                              ((vector<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_> *)
                               local_a8,(long)prev);
          p0 = std::vector<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>::operator[]
                         ((vector<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_> *)local_a8
                          ,(long)max);
          p1 = std::vector<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>::operator[]
                         ((vector<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_> *)local_a8
                          ,(long)last_face._4_4_);
          bVar8 = OnLeftSideOfLine2D<aiVector2t<float>>(p0,p1,pvVar21);
          if (!bVar8) {
            for (next = 0; next < (int)uVar9; next = next + 1) {
              this_00 = std::vector<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>::
                        operator[]((vector<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_> *
                                   )local_a8,(long)next);
              bVar8 = aiVector2t<float>::operator!=(this_00,pvVar21);
              if ((((bVar8) && (bVar8 = aiVector2t<float>::operator!=(this_00,p1), bVar8)) &&
                  (bVar8 = aiVector2t<float>::operator!=(this_00,p0), bVar8)) &&
                 (bVar8 = PointInTriangle2D<aiVector2t<float>>(p0,pvVar21,p1,this_00), bVar8))
              break;
            }
            if (next == uVar9) break;
          }
          max = prev;
          prev = last_face._4_4_;
        }
        paVar7 = temp_verts3d.
                 super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
        if ((int)pnt1 == 2) {
          this_01 = DefaultLogger::get();
          Logger::error(this_01,
                        "Failed to triangulate polygon (no ear found). Probably not a simple polygon?"
                       );
          tmp = 0;
          break;
        }
        paVar6 = temp_verts3d.
                 super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage + 1;
        (temp_verts3d.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
         _M_impl.super__Vector_impl_data._M_end_of_storage)->x = 4.2039e-45;
        pfVar1 = &(temp_verts3d.
                   super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage)->z;
        temp_verts3d.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)&paVar6->y;
        if (*(long *)pfVar1 == 0) {
          pvVar16 = operator_new__(0xc);
          *(void **)&paVar7->z = pvVar16;
        }
        **(int **)&paVar7->z = max;
        *(int *)(*(long *)&paVar7->z + 4) = prev;
        *(int *)(*(long *)&paVar7->z + 8) = last_face._4_4_;
        pbVar22 = std::unique_ptr<bool[],_std::default_delete<bool[]>_>::operator[]
                            ((unique_ptr<bool[],_std::default_delete<bool[]>_> *)
                             &stack0xffffffffffffff40,(long)prev);
        *pbVar22 = true;
      }
      paVar7 = temp_verts3d.
               super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
      if (0 < tmp) {
        paVar6 = temp_verts3d.
                 super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage + 1;
        (temp_verts3d.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
         _M_impl.super__Vector_impl_data._M_end_of_storage)->x = 4.2039e-45;
        pfVar1 = &(temp_verts3d.
                   super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage)->z;
        temp_verts3d.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)&paVar6->y;
        if (*(long *)pfVar1 == 0) {
          pvVar16 = operator_new__(0xc);
          *(void **)&paVar7->z = pvVar16;
        }
        next = 0;
        while (pbVar22 = std::unique_ptr<bool[],_std::default_delete<bool[]>_>::operator[]
                                   ((unique_ptr<bool[],_std::default_delete<bool[]>_> *)
                                    &stack0xffffffffffffff40,(long)next), (*pbVar22 & 1U) != 0) {
          next = next + 1;
        }
        **(int **)&paVar7->z = next;
        do {
          iVar5 = next;
          next = iVar5 + 1;
          pbVar22 = std::unique_ptr<bool[],_std::default_delete<bool[]>_>::operator[]
                              ((unique_ptr<bool[],_std::default_delete<bool[]>_> *)
                               &stack0xffffffffffffff40,(long)next);
        } while ((*pbVar22 & 1U) != 0);
        *(int *)(*(long *)&paVar7->z + 4) = next;
        next = iVar5 + 2;
        while (pbVar22 = std::unique_ptr<bool[],_std::default_delete<bool[]>_>::operator[]
                                   ((unique_ptr<bool[],_std::default_delete<bool[]>_> *)
                                    &stack0xffffffffffffff40,(long)next), (*pbVar22 & 1U) != 0) {
          next = next + 1;
        }
        *(int *)(*(long *)&paVar7->z + 8) = next;
      }
      for (; (pointer)i_1 !=
             temp_verts3d.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage; i_1 = i_1 + 4) {
        puVar3 = *(uint **)(i_1 + 2);
        *puVar3 = puVar11[*puVar3];
        puVar3[1] = puVar11[puVar3[1]];
        puVar3[2] = puVar11[puVar3[2]];
      }
      if (paVar15->mIndices != (uint *)0x0) {
        operator_delete__(paVar15->mIndices);
      }
      paVar15->mIndices = (uint *)0x0;
    }
  }
  paVar15 = _a->mFaces;
  if (paVar15 != (aiFace *)0x0) {
    this_02 = paVar15 + (long)paVar15[-1].mIndices;
    while (paVar15 != this_02) {
      this_02 = this_02 + -1;
      aiFace::~aiFace(this_02);
    }
    operator_delete__(&paVar15[-1].mIndices);
  }
  _a->mFaces = paVar10;
  _a->mNumFaces =
       (uint)((long)temp_verts3d.
                    super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage - (long)paVar10 >> 4);
  this_local._7_1_ = 1;
  std::unique_ptr<bool[],_std::default_delete<bool[]>_>::~unique_ptr
            ((unique_ptr<bool[],_std::default_delete<bool[]>_> *)&stack0xffffffffffffff40);
  std::vector<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>::~vector
            ((vector<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_> *)local_a8);
  std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::~vector
            ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)local_78);
LAB_001b06b1:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool TriangulateProcess::TriangulateMesh( aiMesh* pMesh)
{
    // Now we have aiMesh::mPrimitiveTypes, so this is only here for test cases
    if (!pMesh->mPrimitiveTypes)    {
        bool bNeed = false;

        for( unsigned int a = 0; a < pMesh->mNumFaces; a++) {
            const aiFace& face = pMesh->mFaces[a];

            if( face.mNumIndices != 3)  {
                bNeed = true;
            }
        }
        if (!bNeed)
            return false;
    }
    else if (!(pMesh->mPrimitiveTypes & aiPrimitiveType_POLYGON)) {
        return false;
    }

    // Find out how many output faces we'll get
    unsigned int numOut = 0, max_out = 0;
    bool get_normals = true;
    for( unsigned int a = 0; a < pMesh->mNumFaces; a++) {
        aiFace& face = pMesh->mFaces[a];
        if (face.mNumIndices <= 4) {
            get_normals = false;
        }
        if( face.mNumIndices <= 3) {
            numOut++;

        }
        else {
            numOut += face.mNumIndices-2;
            max_out = std::max(max_out,face.mNumIndices);
        }
    }

    // Just another check whether aiMesh::mPrimitiveTypes is correct
    ai_assert(numOut != pMesh->mNumFaces);

    aiVector3D* nor_out = NULL;

    // if we don't have normals yet, but expect them to be a cheap side
    // product of triangulation anyway, allocate storage for them.
    if (!pMesh->mNormals && get_normals) {
        // XXX need a mechanism to inform the GenVertexNormals process to treat these normals as preprocessed per-face normals
    //  nor_out = pMesh->mNormals = new aiVector3D[pMesh->mNumVertices];
    }

    // the output mesh will contain triangles, but no polys anymore
    pMesh->mPrimitiveTypes |= aiPrimitiveType_TRIANGLE;
    pMesh->mPrimitiveTypes &= ~aiPrimitiveType_POLYGON;

    aiFace* out = new aiFace[numOut](), *curOut = out;
    std::vector<aiVector3D> temp_verts3d(max_out+2); /* temporary storage for vertices */
    std::vector<aiVector2D> temp_verts(max_out+2);

    // Apply vertex colors to represent the face winding?
#ifdef AI_BUILD_TRIANGULATE_COLOR_FACE_WINDING
    if (!pMesh->mColors[0])
        pMesh->mColors[0] = new aiColor4D[pMesh->mNumVertices];
    else
        new(pMesh->mColors[0]) aiColor4D[pMesh->mNumVertices];

    aiColor4D* clr = pMesh->mColors[0];
#endif

#ifdef AI_BUILD_TRIANGULATE_DEBUG_POLYS
    FILE* fout = fopen(POLY_OUTPUT_FILE,"a");
#endif

    const aiVector3D* verts = pMesh->mVertices;

    // use std::unique_ptr to avoid slow std::vector<bool> specialiations
    std::unique_ptr<bool[]> done(new bool[max_out]);
    for( unsigned int a = 0; a < pMesh->mNumFaces; a++) {
        aiFace& face = pMesh->mFaces[a];

        unsigned int* idx = face.mIndices;
        int num = (int)face.mNumIndices, ear = 0, tmp, prev = num-1, next = 0, max = num;

        // Apply vertex colors to represent the face winding?
#ifdef AI_BUILD_TRIANGULATE_COLOR_FACE_WINDING
        for (unsigned int i = 0; i < face.mNumIndices; ++i) {
            aiColor4D& c = clr[idx[i]];
            c.r = (i+1) / (float)max;
            c.b = 1.f - c.r;
        }
#endif

        aiFace* const last_face = curOut;

        // if it's a simple point,line or triangle: just copy it
        if( face.mNumIndices <= 3)
        {
            aiFace& nface = *curOut++;
            nface.mNumIndices = face.mNumIndices;
            nface.mIndices    = face.mIndices;

            face.mIndices = NULL;
            continue;
        }
        // optimized code for quadrilaterals
        else if ( face.mNumIndices == 4) {

            // quads can have at maximum one concave vertex. Determine
            // this vertex (if it exists) and start tri-fanning from
            // it.
            unsigned int start_vertex = 0;
            for (unsigned int i = 0; i < 4; ++i) {
                const aiVector3D& v0 = verts[face.mIndices[(i+3) % 4]];
                const aiVector3D& v1 = verts[face.mIndices[(i+2) % 4]];
                const aiVector3D& v2 = verts[face.mIndices[(i+1) % 4]];

                const aiVector3D& v = verts[face.mIndices[i]];

                aiVector3D left = (v0-v);
                aiVector3D diag = (v1-v);
                aiVector3D right = (v2-v);

                left.Normalize();
                diag.Normalize();
                right.Normalize();

                const float angle = std::acos(left*diag) + std::acos(right*diag);
                if (angle > AI_MATH_PI_F) {
                    // this is the concave point
                    start_vertex = i;
                    break;
                }
            }

            const unsigned int temp[] = {face.mIndices[0], face.mIndices[1], face.mIndices[2], face.mIndices[3]};

            aiFace& nface = *curOut++;
            nface.mNumIndices = 3;
            nface.mIndices = face.mIndices;

            nface.mIndices[0] = temp[start_vertex];
            nface.mIndices[1] = temp[(start_vertex + 1) % 4];
            nface.mIndices[2] = temp[(start_vertex + 2) % 4];

            aiFace& sface = *curOut++;
            sface.mNumIndices = 3;
            sface.mIndices = new unsigned int[3];

            sface.mIndices[0] = temp[start_vertex];
            sface.mIndices[1] = temp[(start_vertex + 2) % 4];
            sface.mIndices[2] = temp[(start_vertex + 3) % 4];

            // prevent double deletion of the indices field
            face.mIndices = NULL;
            continue;
        }
        else
        {
            // A polygon with more than 3 vertices can be either concave or convex.
            // Usually everything we're getting is convex and we could easily
            // triangulate by tri-fanning. However, LightWave is probably the only
            // modeling suite to make extensive use of highly concave, monster polygons ...
            // so we need to apply the full 'ear cutting' algorithm to get it right.

            // RERQUIREMENT: polygon is expected to be simple and *nearly* planar.
            // We project it onto a plane to get a 2d triangle.

            // Collect all vertices of of the polygon.
           for (tmp = 0; tmp < max; ++tmp) {
                temp_verts3d[tmp] = verts[idx[tmp]];
            }

            // Get newell normal of the polygon. Store it for future use if it's a polygon-only mesh
            aiVector3D n;
            NewellNormal<3,3,3>(n,max,&temp_verts3d.front().x,&temp_verts3d.front().y,&temp_verts3d.front().z);
            if (nor_out) {
                 for (tmp = 0; tmp < max; ++tmp)
                     nor_out[idx[tmp]] = n;
            }

            // Select largest normal coordinate to ignore for projection
            const float ax = (n.x>0 ? n.x : -n.x);
            const float ay = (n.y>0 ? n.y : -n.y);
            const float az = (n.z>0 ? n.z : -n.z);

            unsigned int ac = 0, bc = 1; /* no z coord. projection to xy */
            float inv = n.z;
            if (ax > ay) {
                if (ax > az) { /* no x coord. projection to yz */
                    ac = 1; bc = 2;
                    inv = n.x;
                }
            }
            else if (ay > az) { /* no y coord. projection to zy */
                ac = 2; bc = 0;
                inv = n.y;
            }

            // Swap projection axes to take the negated projection vector into account
            if (inv < 0.f) {
                std::swap(ac,bc);
            }

            for (tmp =0; tmp < max; ++tmp) {
                temp_verts[tmp].x = verts[idx[tmp]][ac];
                temp_verts[tmp].y = verts[idx[tmp]][bc];
                done[tmp] = false;
            }

#ifdef AI_BUILD_TRIANGULATE_DEBUG_POLYS
            // plot the plane onto which we mapped the polygon to a 2D ASCII pic
            aiVector2D bmin,bmax;
            ArrayBounds(&temp_verts[0],max,bmin,bmax);

            char grid[POLY_GRID_Y][POLY_GRID_X+POLY_GRID_XPAD];
            std::fill_n((char*)grid,POLY_GRID_Y*(POLY_GRID_X+POLY_GRID_XPAD),' ');

            for (int i =0; i < max; ++i) {
                const aiVector2D& v = (temp_verts[i] - bmin) / (bmax-bmin);
                const size_t x = static_cast<size_t>(v.x*(POLY_GRID_X-1)), y = static_cast<size_t>(v.y*(POLY_GRID_Y-1));
                char* loc = grid[y]+x;
                if (grid[y][x] != ' ') {
                    for(;*loc != ' '; ++loc);
                    *loc++ = '_';
                }
                *(loc+::ai_snprintf(loc, POLY_GRID_XPAD,"%i",i)) = ' ';
            }


            for(size_t y = 0; y < POLY_GRID_Y; ++y) {
                grid[y][POLY_GRID_X+POLY_GRID_XPAD-1] = '\0';
                fprintf(fout,"%s\n",grid[y]);
            }

            fprintf(fout,"\ntriangulation sequence: ");
#endif

            //
            // FIXME: currently this is the slow O(kn) variant with a worst case
            // complexity of O(n^2) (I think). Can be done in O(n).
            while (num > 3) {

                // Find the next ear of the polygon
                int num_found = 0;
                for (ear = next;;prev = ear,ear = next) {

                    // break after we looped two times without a positive match
                    for (next=ear+1;done[(next>=max?next=0:next)];++next);
                    if (next < ear) {
                        if (++num_found == 2) {
                            break;
                        }
                    }
                    const aiVector2D* pnt1 = &temp_verts[ear],
                        *pnt0 = &temp_verts[prev],
                        *pnt2 = &temp_verts[next];

                    // Must be a convex point. Assuming ccw winding, it must be on the right of the line between p-1 and p+1.
                    if (OnLeftSideOfLine2D(*pnt0,*pnt2,*pnt1)) {
                        continue;
                    }

                    // and no other point may be contained in this triangle
                    for ( tmp = 0; tmp < max; ++tmp) {

                        // We need to compare the actual values because it's possible that multiple indexes in
                        // the polygon are referring to the same position. concave_polygon.obj is a sample
                        //
                        // FIXME: Use 'epsiloned' comparisons instead? Due to numeric inaccuracies in
                        // PointInTriangle() I'm guessing that it's actually possible to construct
                        // input data that would cause us to end up with no ears. The problem is,
                        // which epsilon? If we chose a too large value, we'd get wrong results
                        const aiVector2D& vtmp = temp_verts[tmp];
                        if ( vtmp != *pnt1 && vtmp != *pnt2 && vtmp != *pnt0 && PointInTriangle2D(*pnt0,*pnt1,*pnt2,vtmp)) {
                            break;
                        }
                    }
                    if (tmp != max) {
                        continue;
                    }

                    // this vertex is an ear
                    break;
                }
                if (num_found == 2) {

                    // Due to the 'two ear theorem', every simple polygon with more than three points must
                    // have 2 'ears'. Here's definitely something wrong ... but we don't give up yet.
                    //

                    // Instead we're continuing with the standard tri-fanning algorithm which we'd
                    // use if we had only convex polygons. That's life.
                    ASSIMP_LOG_ERROR("Failed to triangulate polygon (no ear found). Probably not a simple polygon?");

#ifdef AI_BUILD_TRIANGULATE_DEBUG_POLYS
                    fprintf(fout,"critical error here, no ear found! ");
#endif
                    num = 0;
                    break;

                    curOut -= (max-num); /* undo all previous work */
                    for (tmp = 0; tmp < max-2; ++tmp) {
                        aiFace& nface = *curOut++;

                        nface.mNumIndices = 3;
                        if (!nface.mIndices)
                            nface.mIndices = new unsigned int[3];

                        nface.mIndices[0] = 0;
                        nface.mIndices[1] = tmp+1;
                        nface.mIndices[2] = tmp+2;

                    }
                    num = 0;
                    break;
                }

                aiFace& nface = *curOut++;
                nface.mNumIndices = 3;

                if (!nface.mIndices) {
                    nface.mIndices = new unsigned int[3];
                }

                // setup indices for the new triangle ...
                nface.mIndices[0] = prev;
                nface.mIndices[1] = ear;
                nface.mIndices[2] = next;

                // exclude the ear from most further processing
                done[ear] = true;
                --num;
            }
            if (num > 0) {
                // We have three indices forming the last 'ear' remaining. Collect them.
                aiFace& nface = *curOut++;
                nface.mNumIndices = 3;
                if (!nface.mIndices) {
                    nface.mIndices = new unsigned int[3];
                }

                for (tmp = 0; done[tmp]; ++tmp);
                nface.mIndices[0] = tmp;

                for (++tmp; done[tmp]; ++tmp);
                nface.mIndices[1] = tmp;

                for (++tmp; done[tmp]; ++tmp);
                nface.mIndices[2] = tmp;

            }
        }

#ifdef AI_BUILD_TRIANGULATE_DEBUG_POLYS

        for(aiFace* f = last_face; f != curOut; ++f) {
            unsigned int* i = f->mIndices;
            fprintf(fout," (%i %i %i)",i[0],i[1],i[2]);
        }

        fprintf(fout,"\n*********************************************************************\n");
        fflush(fout);

#endif

        for(aiFace* f = last_face; f != curOut; ) {
            unsigned int* i = f->mIndices;

            //  drop dumb 0-area triangles - deactivated for now:
            //FindDegenerates post processing step can do the same thing
            //if (std::fabs(GetArea2D(temp_verts[i[0]],temp_verts[i[1]],temp_verts[i[2]])) < 1e-5f) {
            //    ASSIMP_LOG_DEBUG("Dropping triangle with area 0");
            //    --curOut;

            //    delete[] f->mIndices;
            //    f->mIndices = nullptr;

            //    for(aiFace* ff = f; ff != curOut; ++ff) {
            //        ff->mNumIndices = (ff+1)->mNumIndices;
            //        ff->mIndices = (ff+1)->mIndices;
            //        (ff+1)->mIndices = nullptr;
            //    }
            //    continue;
            //}

            i[0] = idx[i[0]];
            i[1] = idx[i[1]];
            i[2] = idx[i[2]];
            ++f;
        }

        delete[] face.mIndices;
        face.mIndices = NULL;
    }

#ifdef AI_BUILD_TRIANGULATE_DEBUG_POLYS
    fclose(fout);
#endif

    // kill the old faces
    delete [] pMesh->mFaces;

    // ... and store the new ones
    pMesh->mFaces    = out;
    pMesh->mNumFaces = (unsigned int)(curOut-out); /* not necessarily equal to numOut */
    return true;
}